

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.cpp
# Opt level: O0

void __thiscall helics::InterfaceInfo::setChangeUpdateFlag(InterfaceInfo *this,bool updateFlag)

{
  bool bVar1;
  pointer pIVar2;
  byte in_SIL;
  long in_RDI;
  unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *input;
  const_iterator __end2;
  const_iterator __begin2;
  handle *__range2;
  shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
  *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  byte in_stack_ffffffffffffff87;
  __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
  local_38;
  undefined1 local_30 [24];
  undefined1 *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 != (*(byte *)(in_RDI + 4) & 1)) {
    *(byte *)(in_RDI + 4) = local_9;
    gmlc::libguarded::
    shared_guarded<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff78);
    local_18 = local_30;
    local_38._M_current =
         (unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
         gmlc::libguarded::
         lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
         ::begin((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                  *)in_stack_ffffffffffffff78);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::end((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
           *)in_stack_ffffffffffffff78);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                        ((__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                         (__normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
                          *)in_stack_ffffffffffffff78);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
      ::operator*(&local_38);
      in_stack_ffffffffffffff87 = local_9;
      pIVar2 = std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>::
               operator->((unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_> *)
                          0x5d1faf);
      pIVar2->only_update_on_change = (bool)(in_stack_ffffffffffffff87 & 1);
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_*,_std::vector<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>,_std::allocator<std::unique_ptr<helics::InputInfo,_std::default_delete<helics::InputInfo>_>_>_>_>
      ::operator++(&local_38);
    }
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
    ::~lock_handle((lock_handle<gmlc::containers::DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>,_std::shared_mutex>
                    *)0x5d1f72);
  }
  return;
}

Assistant:

void InterfaceInfo::setChangeUpdateFlag(bool updateFlag)
{
    if (updateFlag != only_update_on_change) {
        only_update_on_change = updateFlag;
        // input is a reference to a unique_ptr
        for (auto& input : inputs.lock()) {  // NOLINT(readability-qualified-auto)
            input->only_update_on_change = updateFlag;
        }
    }
}